

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::PsbtScriptData::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData> *in_stack_fffffffffffffd48;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData> *in_stack_fffffffffffffd50;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData> *this;
  char (*in_stack_fffffffffffffd58) [4];
  char (*__args) [5];
  function<void_(cfd::api::json::PsbtScriptData_&,_const_UniValue_&)> *in_stack_fffffffffffffd60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>_>_>_>
  *this_00;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData> local_231;
  allocator local_199;
  value_type local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  value_type local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>_>_>_>
                   *)0x6ec5c3);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffd50);
    std::function<std::__cxx11::string(cfd::api::json::PsbtScriptData_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtScriptData_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtScriptData_&)>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtScriptData_ptr
                *)in_stack_fffffffffffffd58);
    std::function<void(cfd::api::json::PsbtScriptData&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtScriptData&,UniValue_const&),void>
              (in_stack_fffffffffffffd60,
               (_func_void_PsbtScriptData_ptr_UniValue_ptr *)in_stack_fffffffffffffd58);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>::operator=
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffd50);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>_>_>_>
                        *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                       in_stack_fffffffffffffd50);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"asm",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::PsbtScriptData_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtScriptData_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtScriptData_&)>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtScriptData_ptr
                *)in_stack_fffffffffffffd58);
    std::function<void(cfd::api::json::PsbtScriptData&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtScriptData&,UniValue_const&),void>
              (in_stack_fffffffffffffd60,
               (_func_void_PsbtScriptData_ptr_UniValue_ptr *)in_stack_fffffffffffffd58);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>::operator=
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffd50);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>_>_>_>
                        *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                       in_stack_fffffffffffffd50);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"hex",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    __args = (char (*) [5])((long)&local_231.set_function.super__Function_base._M_manager + 1);
    std::function<std::__cxx11::string(cfd::api::json::PsbtScriptData_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtScriptData_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtScriptData_&)>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtScriptData_ptr
                *)__args);
    std::function<void(cfd::api::json::PsbtScriptData&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtScriptData&,UniValue_const&),void>
              (in_stack_fffffffffffffd60,(_func_void_PsbtScriptData_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffd60,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>::operator=
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffd50);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>&>
                      (this_00,__args,in_stack_fffffffffffffd50);
    local_231.set_function.super__Function_base._M_functor._1_8_ = pVar2.first._M_node;
    local_231.set_function.super__Function_base._M_functor._M_pod_data[9] = pVar2.second;
    this = &local_231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)local_231.get_function.super__Function_base._M_functor._M_pod_data + 1),"type"
               ,(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,
                (value_type *)
                ((long)local_231.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::__cxx11::string::~string
              ((string *)
               ((long)local_231.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtScriptData>::~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void PsbtScriptData::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<PsbtScriptData> func_table;  // NOLINT

  func_table = {
    PsbtScriptData::GetAsmString,
    PsbtScriptData::SetAsmString,
    PsbtScriptData::GetAsmFieldType,
  };
  json_mapper.emplace("asm", func_table);
  item_list.push_back("asm");
  func_table = {
    PsbtScriptData::GetHexString,
    PsbtScriptData::SetHexString,
    PsbtScriptData::GetHexFieldType,
  };
  json_mapper.emplace("hex", func_table);
  item_list.push_back("hex");
  func_table = {
    PsbtScriptData::GetTypeString,
    PsbtScriptData::SetTypeString,
    PsbtScriptData::GetTypeFieldType,
  };
  json_mapper.emplace("type", func_table);
  item_list.push_back("type");
}